

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

char * make_voice_path(OpenJTalk *oj,char *path)

{
  char cVar1;
  _Bool _Var2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  uint *pc;
  long lVar6;
  uint *wildcard;
  uint c;
  char temp [260];
  char name_extended [260];
  uint local_23c;
  char local_238 [272];
  uint local_128 [66];
  
  if (oj == (OpenJTalk *)0x0) {
    return (char *)0x0;
  }
  memset(local_238,0,0x104);
  if ((path == (char *)0x0) || (*path == '\0')) {
    if (oj->dn_voice_dir_path[0] == '\0') {
      return (char *)0x0;
    }
    local_128[0] = 0;
    _Var2 = search_file_recursive(oj->dn_voice_dir_path,G_VOICE_DEFAULT,local_238,local_128,200);
    if (_Var2) goto LAB_001416ba;
    pc = local_128;
    local_128[0] = 0;
    wildcard = (uint *)G_VOICE_WILDCARD;
LAB_0014161c:
    _Var2 = search_file_recursive(oj->dn_voice_dir_path,(char *)wildcard,local_238,pc,200);
  }
  else {
    _Var2 = is_name_only(path);
    if (_Var2) {
      sVar3 = strlen(path);
      pcVar5 = G_VOICE_EXT;
      sVar4 = strlen(G_VOICE_EXT);
      if ((sVar4 + sVar3) - 0x104 < 0xfffffffffffffefb) {
        return (char *)0x0;
      }
      strcpy((char *)local_128,path);
      strcat((char *)local_128,pcVar5);
      pc = &local_23c;
      local_23c = 0;
      wildcard = local_128;
      goto LAB_0014161c;
    }
    _Var2 = is_relative(path);
    if (_Var2) {
      sVar3 = strlen(oj->dn_voice_dir_path);
      if (sVar3 == 0) {
        return (char *)0x0;
      }
      sVar4 = strlen(path);
      if ((sVar4 + sVar3) - 0x103 < 0xfffffffffffffefb) {
        return (char *)0x0;
      }
      strcpy(local_238,oj->dn_voice_dir_path);
      strcat(local_238,G_SLASH_CHAR);
      strcat(local_238,path);
    }
    else {
      strcpy(local_238,path);
    }
    _Var2 = exists_file(local_238);
  }
  if (_Var2 == false) {
    return (char *)0x0;
  }
LAB_001416ba:
  sVar3 = strlen(local_238);
  pcVar5 = (char *)malloc(sVar3 + 1);
  if (pcVar5 == (char *)0x0) {
    return (char *)0x0;
  }
  lVar6 = 0;
  do {
    cVar1 = local_238[lVar6];
    pcVar5[lVar6] = cVar1;
    lVar6 = lVar6 + 1;
  } while (cVar1 != '\0');
  return pcVar5;
}

Assistant:

char *make_voice_path(OpenJTalk *oj, const char *path)
{
	if (!oj)
	{
		return NULL;
	}

	char temp[MAX_PATH];
	clear_path_string(temp, MAX_PATH);

	// パスが指定されていないとき、
	if (path == NULL || strlen(path) == 0)
	{
		// 音響モデルファイルフォルダが確定されていれば
		if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
		{
			// 標準名の音響モデルファイルを探す
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_DEFAULT, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}

			// 無ければ、何か音響モデルファイルを探す
			c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, G_VOICE_WILDCARD, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
		}

		// パスが指定されていないとき、決まらなければ、偽を返す
		return NULL;
	}
	// パスが指定されているとき
	else
	{
		// 名前のみの表記の場合、
		if (is_name_only(path))
		{
			if (strlen(path) + strlen(G_VOICE_EXT) + 1 > MAX_PATH)
			{
				return NULL;
			}

			char name_extended[MAX_PATH];
			strcat(strcpy(name_extended, path), G_VOICE_EXT);
			unsigned int c = 0;
			if (search_file_recursive(oj->dn_voice_dir_path, name_extended, temp, &c, VOICESEARCHMAX))
			{
				goto return_true;
			}
			return NULL;
		}

		// 相対指定の場合、
		if (is_relative(path))
		{
			if (oj->dn_voice_dir_path != NULL && strlen(oj->dn_voice_dir_path) != 0)
			{
				if (strlen(oj->dn_voice_dir_path) + 1 + strlen(path) + 1 > MAX_PATH)
				{
					return false;
				}

				strcpy(temp, oj->dn_voice_dir_path);
				strcat(temp, G_SLASH_CHAR);
				strcat(temp, path);
				if (exists_file(temp))
				{
					goto return_true;
				}
			}
		}
		// 絶対指定の場合、
		else
		{
			strcpy(temp, path);
			if (exists_file(temp))
			{
				goto return_true;
			}
		}
	}
	return NULL;

return_true:
	if (temp == NULL)
	{
		return NULL;
	}
	char *r = malloc(strlen(temp) + 1);
	if (r == NULL)
	{
		return NULL;
	}
	char *s = temp;
	char *d = r;
	while ((*d++ = *s++) != '\0')
	{
	}
	return r;
}